

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long *__dest;
  const_iterator cVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  int *piVar14;
  ulong uVar15;
  undefined8 uVar16;
  long *plVar17;
  long lVar18;
  int i;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [12];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  argm;
  string message;
  GGWave ggWave;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_688 [8];
  _Rb_tree_node_base local_680;
  undefined8 local_658;
  int local_650;
  undefined4 uStack_64c;
  uint auStack_648 [6];
  long local_630;
  key_type local_628;
  key_type local_608;
  key_type local_5e8 [45];
  
  printf("Usage: %s [-p] [-b] [-tN] [-lN]\n",*argv);
  puts("    -p  - print tones, no playback");
  puts("    -A  - print Arduino code");
  puts("    -b  - use \'beep\' command");
  puts("    -s  - use Direct Sequence Spread (DSS)");
  puts("    -tN - transmission protocol");
  printf("    -lN - fixed payload length of size N, N in [1, %d]\n",0x40);
  putchar(10);
  __dest = (long *)GGWave::Protocols::tx();
  memcpy(__dest,&PTR_anon_var_dwarf_2843_00104c20,0x160);
  parseCmdArguments_abi_cxx11_((int)local_688,(char **)(ulong)(uint)argc);
  paVar1 = &local_5e8[0].field_2;
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"p","");
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(local_688,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"A","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(local_688,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"b","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(local_688,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"s","");
  cVar11 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(local_688,local_5e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"t","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(local_688,local_5e8);
  uVar15 = 0;
  if (cVar12._M_node != &local_680) {
    local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"t","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_688,&local_608);
    pcVar3 = (pmVar13->_M_dataplus)._M_p;
    piVar14 = __errno_location();
    iVar7 = *piVar14;
    *piVar14 = 0;
    uVar15 = strtol(pcVar3,(char **)&local_658,10);
    if ((char *)CONCAT44(local_658._4_4_,(ggwave_ProtocolId)local_658) == pcVar3) {
      std::__throw_invalid_argument("stoi");
    }
    else if (((long)(int)uVar15 == uVar15) && (*piVar14 != 0x22)) {
      if (*piVar14 == 0) {
        *piVar14 = iVar7;
      }
      goto LAB_00102792;
    }
    std::__throw_out_of_range("stoi");
LAB_00102c16:
    std::__throw_invalid_argument("stoi");
LAB_00102c22:
    uVar16 = std::__throw_out_of_range("stoi");
    if ((uint *)CONCAT44(local_658._4_4_,(ggwave_ProtocolId)local_658) != auStack_648) {
      operator_delete((uint *)CONCAT44(local_658._4_4_,(ggwave_ProtocolId)local_658));
    }
    GGWave::~GGWave((GGWave *)local_5e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_688);
    _Unwind_Resume(uVar16);
  }
LAB_00102792:
  if ((cVar12._M_node != &local_680) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2)) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != &local_5e8[0].field_2) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  local_5e8[0]._M_dataplus._M_p = (pointer)&local_5e8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5e8,"l","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(local_688,local_5e8);
  uVar19 = 0x10;
  if (cVar12._M_node != &local_680) {
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_628,"l","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_688,&local_628);
    pcVar3 = (pmVar13->_M_dataplus)._M_p;
    piVar14 = __errno_location();
    iVar7 = *piVar14;
    *piVar14 = 0;
    uVar19 = strtol(pcVar3,(char **)&local_658,10);
    if ((char *)CONCAT44(local_658._4_4_,(ggwave_ProtocolId)local_658) == pcVar3) goto LAB_00102c16;
    if (((long)(int)uVar19 != uVar19) || (*piVar14 == 0x22)) goto LAB_00102c22;
    if (*piVar14 == 0) {
      *piVar14 = iVar7;
    }
  }
  if ((cVar12._M_node != &local_680) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2)) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8[0]._M_dataplus._M_p != &local_5e8[0].field_2) {
    operator_delete(local_5e8[0]._M_dataplus._M_p);
  }
  auStack_648[4] = (uint)(cVar11._M_node != &local_680) << 4 | 0xc;
  local_658._4_4_ = 0x473b8000;
  local_650 = 0x473b8000;
  uStack_64c = 0x473b8000;
  auStack_648[0] = 0x400;
  auStack_648[1] = 0x40400000;
  auStack_648[2] = 5;
  auStack_648[3] = 5;
  local_658._0_4_ = (int)uVar19;
  GGWave::GGWave((GGWave *)local_5e8,(ggwave_Parameters *)&local_658);
  puts("Available Tx protocols:");
  uVar20 = 0;
  plVar17 = __dest;
  do {
    if ((*(char *)((long)plVar17 + 0xd) == '\x01') && (*plVar17 != 0)) {
      printf("    -t%-2d : %-16s\n",uVar20 & 0xffffffff);
    }
    uVar20 = uVar20 + 1;
    plVar17 = plVar17 + 2;
  } while (uVar20 != 0x16);
  putchar(10);
  if ((uint)uVar15 < 0x16) {
    printf("Selecting Tx protocol %d\n",uVar15 & 0xffffffff);
    iVar7 = 1;
    if (((cVar9._M_node == &local_680) && (cVar8._M_node == &local_680)) &&
       (cVar10._M_node == &local_680)) {
      iVar6 = ioctl(1,0x4b30,0);
      if (iVar6 != 0) {
        iVar7 = open("/dev/tty0",0);
      }
      if (iVar7 < 0) {
        main_cold_1();
        iVar7 = 1;
        goto LAB_00102bac;
      }
    }
    fwrite("Enter a text message:\n",0x16,1,_stderr);
    local_658 = auStack_648;
    local_650 = 0;
    uStack_64c = 0;
    auStack_648[0] = auStack_648[0] & 0xffffff00;
    cVar5 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_658,cVar5);
    putchar(10);
    if ((char *)CONCAT44(uStack_64c,local_650) == (char *)0x0) {
      main_cold_2();
      iVar7 = -2;
    }
    else if ((int)uVar19 < local_650) {
      fprintf(_stderr,"Invalid message: size > %d\n",uVar19 & 0xffffffff);
      iVar7 = -3;
    }
    else {
      GGWave::init((int)local_5e8,(char *)CONCAT44(uStack_64c,local_650),
                   (ggwave_ProtocolId)local_658,(uint)uVar15);
      GGWave::encode();
      auVar23 = GGWave::txTones();
      local_630 = auVar23._0_8_;
      iVar6 = GGWave::samplesPerFrame();
      fVar21 = (float)GGWave::sampleRateOut();
      if (auVar23._8_4_ == 0) {
        iVar7 = 0;
      }
      else {
        cVar5 = *(char *)((long)__dest + (uVar15 & 0xffffffff) * 0x10 + 10);
        lVar18 = 0;
        do {
          lVar4 = __dest[(uVar15 & 0xffffffff) * 2 + 1];
          cVar2 = *(char *)(local_630 + lVar18);
          fVar22 = (float)GGWave::hzPerSample();
          processTone(iVar7,(double)(fVar22 * (float)((int)cVar2 + (int)(short)lVar4)),
                      (long)(int)((float)(int)cVar5 * (((float)iVar6 * 1000.0) / fVar21)),
                      cVar10._M_node != &local_680,cVar8._M_node != &local_680,
                      cVar9._M_node != &local_680);
          lVar18 = lVar18 + 1;
        } while (auVar23._8_4_ != lVar18);
        iVar7 = 0;
      }
    }
    if (local_658 != auStack_648) {
      operator_delete(local_658);
    }
  }
  else {
    fprintf(_stderr,"Unknown Tx protocol %d\n",uVar15 & 0xffffffff);
    iVar7 = -3;
  }
LAB_00102bac:
  GGWave::~GGWave((GGWave *)local_5e8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_688);
  return iVar7;
}

Assistant:

int main(int argc, char** argv) {
    printf("Usage: %s [-p] [-b] [-tN] [-lN]\n", argv[0]);
    printf("    -p  - print tones, no playback\n");
    printf("    -A  - print Arduino code\n");
    printf("    -b  - use 'beep' command\n");
    printf("    -s  - use Direct Sequence Spread (DSS)\n");
    printf("    -tN - transmission protocol\n");
    printf("    -lN - fixed payload length of size N, N in [1, %d]\n", GGWave::kMaxLengthFixed);
    printf("\n");

    auto & protocols = GGWave::Protocols::tx();
    protocols = { {
        { "[R2T2] Normal",      64,  9, 1, 2, true, },
        { "[R2T2] Fast",        64,  6, 1, 2, true, },
        { "[R2T2] Fastest",     64,  3, 1, 2, true, },
        { "[R2T2] Low Normal",  16,  9, 1, 2, true, },
        { "[R2T2] Low Fast",    16,  6, 1, 2, true, },
        { "[R2T2] Low Fastest", 16,  3, 1, 2, true, },
    } };

    const auto argm         = parseCmdArguments(argc, argv);
    const bool printTones   = argm.count("p") > 0;
    const bool printArduino = argm.count("A") > 0;
    const bool useBeep      = argm.count("b") > 0;
    const bool useDSS       = argm.count("s") > 0;
    const int txProtocolId  = argm.count("t") == 0 ? 0 : std::stoi(argm.at("t"));
    const int payloadLength = argm.count("l") == 0 ? 16 : std::stoi(argm.at("l"));

    GGWave::OperatingMode mode = GGWAVE_OPERATING_MODE_TX | GGWAVE_OPERATING_MODE_TX_ONLY_TONES;
    if (useDSS) mode |= GGWAVE_OPERATING_MODE_USE_DSS;

    GGWave ggWave({
        payloadLength,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSampleRate,
        GGWave::kDefaultSamplesPerFrame,
        GGWave::kDefaultSoundMarkerThreshold,
        GGWAVE_SAMPLE_FORMAT_F32,
        GGWAVE_SAMPLE_FORMAT_F32,
        mode,
    });

    printf("Available Tx protocols:\n");
    for (int i = 0; i < (int) protocols.size(); ++i) {
        const auto & protocol = protocols[i];
        if (protocol.enabled && protocol.name) {
            printf("    -t%-2d : %-16s\n", i, protocol.name);
        }
    }
    printf("\n");

    if (txProtocolId < 0 || txProtocolId >= (int) protocols.size()) {
        fprintf(stderr, "Unknown Tx protocol %d\n", txProtocolId);
        return -3;
    }

    printf("Selecting Tx protocol %d\n", txProtocolId);

    int fd = 1;
    if (useBeep == false && printTones == false && printArduino == false) {
        if (ioctl(fd, KDMKTONE, 0)) {
            fd = open(CONSOLE, O_RDONLY);
        }
        if (fd < 0) {
            perror(CONSOLE);
            fprintf(stderr, "This program must be run as root\n");
            return 1;
        }
    }

    fprintf(stderr, "Enter a text message:\n");

    std::string message;
    std::getline(std::cin, message);

    printf("\n");

    if (message.size() == 0) {
        fprintf(stderr, "Invalid message: size = 0\n");
        return -2;
    }

    if ((int) message.size() > payloadLength) {
        fprintf(stderr, "Invalid message: size > %d\n", payloadLength);
        return -3;
    }

    ggWave.init(message.size(), message.data(), GGWave::TxProtocolId(txProtocolId), 10);
    ggWave.encode();

    const auto & protocol = protocols[txProtocolId];
    const auto tones = ggWave.txTones();
    const auto duration_ms = protocol.txDuration_ms(ggWave.samplesPerFrame(), ggWave.sampleRateOut());
    for (auto & tone : tones) {
        const auto freq_hz = (protocol.freqStart + tone)*ggWave.hzPerSample();
        processTone(fd, freq_hz, duration_ms, useBeep, printTones, printArduino);
    }

    return 0;
}